

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  allocator<vkt::Draw::PositionColorVertex> *this_00;
  uint uVar1;
  deUint32 dVar2;
  bool bVar3;
  reference pvVar4;
  ulong __n;
  pointer pVVar5;
  pointer pPVar6;
  float fVar7;
  float fVar8;
  float z_;
  float w_;
  uint local_14c;
  Vector<float,_4> local_138;
  undefined1 local_128 [8];
  VecAccess<float,_4,_4> colorAccess;
  undefined1 local_100 [8];
  VecAccess<float,_4,_4> positionAccess;
  iterator vertexIt;
  iterator iStack_d8;
  deUint32 idx;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_d0;
  iterator vertexStart;
  __normal_iterator<vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
  local_c0;
  __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
  local_b8;
  const_iterator it_1;
  Vector<float,_4> local_90;
  PositionColorVertex local_80;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_60;
  uint local_44;
  iterator iStack_40;
  deUint32 index;
  __normal_iterator<vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
  local_38;
  __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
  local_30;
  const_iterator it;
  undefined1 local_20 [4];
  deUint32 lastIndex;
  Random rnd;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this_local;
  
  rnd.m_rnd._8_8_ = this;
  pvVar4 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::
           operator[](&(this->m_data).commands,0);
  uVar1 = pvVar4->vertexCount;
  pvVar4 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::
           operator[](&(this->m_data).commands,0);
  de::Random::Random((Random *)local_20,uVar1 ^ 0xc2a39f ^ pvVar4->firstVertex);
  it._M_current._4_4_ = 0;
  local_38._M_current =
       (VkDrawIndirectCommand *)
       std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::begin
                 (&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndirectCommand_const*,std::vector<vk::VkDrawIndirectCommand,std::allocator<vk::VkDrawIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndirectCommand_const*,std::vector<vk::VkDrawIndirectCommand,std::allocator<vk::VkDrawIndirectCommand>>>
              *)&local_30,&local_38);
  while( true ) {
    iStack_40 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::
                end(&(this->m_data).commands);
    bVar3 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc0);
    if (!bVar3) break;
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
             ::operator->(&local_30);
    dVar2 = pVVar5->firstVertex;
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
             ::operator->(&local_30);
    local_44 = dVar2 + pVVar5->vertexCount;
    local_14c = local_44;
    if (local_44 <= it._M_current._4_4_) {
      local_14c = it._M_current._4_4_;
    }
    it._M_current._4_4_ = local_14c;
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
    ::operator++(&local_30);
  }
  __n = (ulong)it._M_current._4_4_;
  tcu::Vector<float,_4>::Vector(&local_90,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&it_1._M_current + 4),0.0,0.0,0.0,0.0);
  PositionColorVertex::PositionColorVertex(&local_80,&local_90,(Vec4 *)((long)&it_1._M_current + 4))
  ;
  this_00 = (allocator<vkt::Draw::PositionColorVertex> *)((long)&it_1._M_current + 3);
  std::allocator<vkt::Draw::PositionColorVertex>::allocator(this_00);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector(&local_60,__n,&local_80,this_00);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  operator=((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             *)&this->m_data,&local_60);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  ~vector(&local_60);
  std::allocator<vkt::Draw::PositionColorVertex>::~allocator
            ((allocator<vkt::Draw::PositionColorVertex> *)((long)&it_1._M_current + 3));
  local_c0._M_current =
       (VkDrawIndirectCommand *)
       std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::begin
                 (&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndirectCommand_const*,std::vector<vk::VkDrawIndirectCommand,std::allocator<vk::VkDrawIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndirectCommand_const*,std::vector<vk::VkDrawIndirectCommand,std::allocator<vk::VkDrawIndirectCommand>>>
              *)&local_b8,&local_c0);
  while( true ) {
    vertexStart._M_current =
         (PositionColorVertex *)
         std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::end
                   (&(this->m_data).commands);
    bVar3 = __gnu_cxx::operator!=
                      (&local_b8,
                       (__normal_iterator<vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
                        *)&vertexStart);
    if (!bVar3) break;
    iStack_d8 = std::
                vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ::begin((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                         *)&this->m_data);
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
             ::operator->(&local_b8);
    local_d0 = __gnu_cxx::
               __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
               ::operator+(&stack0xffffffffffffff28,(ulong)pVVar5->firstVertex);
    for (vertexIt._M_current._4_4_ = 0;
        pVVar5 = __gnu_cxx::
                 __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
                 ::operator->(&local_b8), vertexIt._M_current._4_4_ < pVVar5->vertexCount;
        vertexIt._M_current._4_4_ = vertexIt._M_current._4_4_ + 1) {
      positionAccess.m_index._8_8_ =
           __gnu_cxx::
           __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
           ::operator+(&local_d0,(ulong)vertexIt._M_current._4_4_);
      pPVar6 = __gnu_cxx::
               __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
               ::operator->((__normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                             *)(positionAccess.m_index + 2));
      tcu::Vector<float,_4>::xyzw((VecAccess<float,_4,_4> *)local_100,&pPVar6->position);
      fVar7 = de::Random::getFloat((Random *)local_20,-1.0,1.0);
      fVar8 = de::Random::getFloat((Random *)local_20,-1.0,1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(colorAccess.m_index + 2),fVar7,fVar8,1.0,1.0);
      tcu::VecAccess<float,_4,_4>::operator=
                ((VecAccess<float,_4,_4> *)local_100,(Vector<float,_4> *)(colorAccess.m_index + 2));
      pPVar6 = __gnu_cxx::
               __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
               ::operator->((__normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                             *)(positionAccess.m_index + 2));
      tcu::Vector<float,_4>::xyzw((VecAccess<float,_4,_4> *)local_128,&pPVar6->color);
      fVar7 = de::Random::getFloat((Random *)local_20,0.0,1.0);
      fVar8 = de::Random::getFloat((Random *)local_20,0.0,1.0);
      z_ = de::Random::getFloat((Random *)local_20,0.0,1.0);
      w_ = de::Random::getFloat((Random *)local_20,0.0,1.0);
      tcu::Vector<float,_4>::Vector(&local_138,fVar7,fVar8,z_,w_);
      tcu::VecAccess<float,_4,_4>::operator=((VecAccess<float,_4,_4> *)local_128,&local_138);
    }
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
    ::operator++(&local_b8);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void DrawTestInstance<DrawIndirectParams>::generateDrawData (void)
{
	de::Random	rnd(SEED ^ m_data.commands[0].vertexCount ^ m_data.commands[0].firstVertex);

	deUint32 lastIndex	= 0;

	// Find the interval which will be used
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index = it->firstVertex + it->vertexCount;
		lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize with zeros
	m_data.vertices = std::vector<PositionColorVertex>(lastIndex, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices only where necessary
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<PositionColorVertex>::iterator vertexStart = m_data.vertices.begin() + it->firstVertex;

		for (deUint32 idx = 0; idx < it->vertexCount; ++idx)
		{
			std::vector<PositionColorVertex>::iterator vertexIt = vertexStart + idx;

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}